

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

PSprite __thiscall SpriteBase::create_mask(SpriteBase *this,PSprite *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined1 auVar7 [16];
  PSprite PVar8;
  __shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2> a_Stack_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<Data::Sprite> local_38;
  
  p_Var1 = other[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auVar7 = (**(code **)(*(long *)*in_RDX + 8))();
  _Var6._M_pi = auVar7._8_8_;
  if (p_Var1 == auVar7._0_8_) {
    peVar2 = other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar7 = (**(code **)(*(long *)*in_RDX + 0x10))();
    _Var6._M_pi = auVar7._8_8_;
    if (peVar2 == auVar7._0_8_) {
      std::__shared_ptr<Data::Sprite,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Data::Sprite,void>
                (a_Stack_48,
                 (__weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> *)
                 &(other->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
      ;
      std::make_shared<SpriteBase,std::shared_ptr<Data::Sprite>>(&local_38);
      _Var6._M_pi = local_38.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar2 = local_38.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_Sprite)._vptr_Sprite =
           (_func_int **)
           local_38.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_38.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
      super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var6._M_pi;
      local_38.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
      p_Var1 = other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      lVar4 = (*(code *)**(undefined8 **)*in_RDX)();
      iVar3 = (**peVar2->_vptr_Sprite)(peVar2);
      uVar5 = (long)other[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr *
              (long)other[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      for (_Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ((ulong)_Var6._M_pi & 0xffffffff) <= uVar5 &&
          uVar5 - ((ulong)_Var6._M_pi & 0xffffffff) != 0;
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(_Var6._M_pi)->_vptr__Sp_counted_base + 1)) {
        *(uint *)(CONCAT44(extraout_var,iVar3) + (long)_Var6._M_pi * 4) =
             -(uint)(*(int *)((long)&p_Var1->_vptr__Sp_counted_base + (long)_Var6._M_pi * 4) !=
                    *(int *)(lVar4 + (long)_Var6._M_pi * 4));
      }
      goto LAB_00133b48;
    }
  }
  (this->super_Sprite)._vptr_Sprite = (_func_int **)0x0;
  (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
  super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_00133b48:
  PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Sprite;
  return (PSprite)PVar8.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
SpriteBase::create_mask(Data::PSprite other) {
  if ((width != other->get_width()) || (height != other->get_height())) {
    return nullptr;
  }

  Data::PSprite result = std::make_shared<SpriteBase>(shared_from_this());

  uint32_t *src1 = reinterpret_cast<uint32_t*>(data);
  uint32_t *src2 = reinterpret_cast<uint32_t*>(other->get_data());
  uint32_t *res = reinterpret_cast<uint32_t*>(result->get_data());

  for (unsigned int i = 0; i < width * height; i++) {
    if (*src1++ == *src2++) {
      *res++ = 0x00000000;
    } else {
      *res++ = 0xFFFFFFFF;
    }
  }

  return result;
}